

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

void prvTidyUngetChar(uint c,StreamIn *in)

{
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var1;
  tchar *ptVar2;
  uint uVar3;
  StreamIn *in_local;
  uint c_local;
  
  if (c != 0xffffffff) {
    in->pushed = yes;
    if (in->bufsize <= in->bufpos + 1) {
      p_Var1 = in->allocator->vtbl->realloc;
      uVar3 = in->bufsize + 1;
      in->bufsize = uVar3;
      ptVar2 = (tchar *)(*p_Var1)(in->allocator,in->charbuf,(ulong)uVar3 << 2);
      in->charbuf = ptVar2;
    }
    uVar3 = in->bufpos;
    in->bufpos = uVar3 + 1;
    in->charbuf[uVar3] = c;
    if (c == 10) {
      in->curline = in->curline + -1;
    }
    RestoreLastPos(in);
  }
  return;
}

Assistant:

void TY_(UngetChar)( uint c, StreamIn *in )
{
    if (c == EndOfStream)
    {
        /* fprintf(stderr, "Attempt to UngetChar EOF\n"); */
        return;
    }
    
    in->pushed = yes;

    if (in->bufpos + 1 >= in->bufsize)
        in->charbuf = (tchar*)TidyRealloc(in->allocator, in->charbuf, sizeof(tchar) * ++(in->bufsize));

    in->charbuf[(in->bufpos)++] = c;

    if (c == '\n')
        --(in->curline);

    RestoreLastPos( in );
}